

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::Compiler::get_work_group_size_specialization_constants
          (Compiler *this,SpecializationConstant *x,SpecializationConstant *y,
          SpecializationConstant *z)

{
  uint32_t uVar1;
  SPIREntryPoint *pSVar2;
  SPIRConstant *pSVar3;
  ID IVar4;
  
  pSVar2 = get_entry_point(this);
  x->id = 0;
  x->constant_id = 0;
  y->id = 0;
  y->constant_id = 0;
  z->id = 0;
  z->constant_id = 0;
  uVar1 = (pSVar2->workgroup_size).constant;
  if (uVar1 == 0) {
    if (((pSVar2->flags).lower & 0x4000000000) == 0) goto LAB_00286231;
    pSVar3 = get<spirv_cross::SPIRConstant>(this,(pSVar2->workgroup_size).id_x);
    if (pSVar3->specialization == true) {
      IVar4.id = (pSVar2->workgroup_size).id_x;
      (x->id).id = IVar4.id;
      uVar1 = ParsedIR::get_decoration(&this->ir,IVar4,DecorationSpecId);
      x->constant_id = uVar1;
    }
    pSVar3 = get<spirv_cross::SPIRConstant>(this,(pSVar2->workgroup_size).id_y);
    if (pSVar3->specialization == true) {
      IVar4.id = (pSVar2->workgroup_size).id_y;
      (y->id).id = IVar4.id;
      uVar1 = ParsedIR::get_decoration(&this->ir,IVar4,DecorationSpecId);
      y->constant_id = uVar1;
    }
    pSVar3 = get<spirv_cross::SPIRConstant>(this,(pSVar2->workgroup_size).id_z);
    if (pSVar3->specialization != true) goto LAB_00286231;
    IVar4.id = (pSVar2->workgroup_size).id_z;
    (z->id).id = IVar4.id;
  }
  else {
    pSVar3 = get<spirv_cross::SPIRConstant>(this,uVar1);
    uVar1 = (pSVar3->m).c[0].id[0].id;
    if (uVar1 != 0) {
      (x->id).id = uVar1;
      uVar1 = ParsedIR::get_decoration(&this->ir,(ID)(pSVar3->m).c[0].id[0].id,DecorationSpecId);
      x->constant_id = uVar1;
    }
    uVar1 = (pSVar3->m).c[0].id[1].id;
    if (uVar1 != 0) {
      (y->id).id = uVar1;
      uVar1 = ParsedIR::get_decoration(&this->ir,(ID)(pSVar3->m).c[0].id[1].id,DecorationSpecId);
      y->constant_id = uVar1;
    }
    uVar1 = (pSVar3->m).c[0].id[2].id;
    if (uVar1 == 0) goto LAB_00286231;
    (z->id).id = uVar1;
    IVar4.id = (pSVar3->m).c[0].id[2].id;
  }
  uVar1 = ParsedIR::get_decoration(&this->ir,IVar4,DecorationSpecId);
  z->constant_id = uVar1;
LAB_00286231:
  return (pSVar2->workgroup_size).constant;
}

Assistant:

uint32_t Compiler::get_work_group_size_specialization_constants(SpecializationConstant &x, SpecializationConstant &y,
                                                                SpecializationConstant &z) const
{
	auto &execution = get_entry_point();
	x = { 0, 0 };
	y = { 0, 0 };
	z = { 0, 0 };

	// WorkgroupSize builtin takes precedence over LocalSize / LocalSizeId.
	if (execution.workgroup_size.constant != 0)
	{
		auto &c = get<SPIRConstant>(execution.workgroup_size.constant);

		if (c.m.c[0].id[0] != ID(0))
		{
			x.id = c.m.c[0].id[0];
			x.constant_id = get_decoration(c.m.c[0].id[0], DecorationSpecId);
		}

		if (c.m.c[0].id[1] != ID(0))
		{
			y.id = c.m.c[0].id[1];
			y.constant_id = get_decoration(c.m.c[0].id[1], DecorationSpecId);
		}

		if (c.m.c[0].id[2] != ID(0))
		{
			z.id = c.m.c[0].id[2];
			z.constant_id = get_decoration(c.m.c[0].id[2], DecorationSpecId);
		}
	}
	else if (execution.flags.get(ExecutionModeLocalSizeId))
	{
		auto &cx = get<SPIRConstant>(execution.workgroup_size.id_x);
		if (cx.specialization)
		{
			x.id = execution.workgroup_size.id_x;
			x.constant_id = get_decoration(execution.workgroup_size.id_x, DecorationSpecId);
		}

		auto &cy = get<SPIRConstant>(execution.workgroup_size.id_y);
		if (cy.specialization)
		{
			y.id = execution.workgroup_size.id_y;
			y.constant_id = get_decoration(execution.workgroup_size.id_y, DecorationSpecId);
		}

		auto &cz = get<SPIRConstant>(execution.workgroup_size.id_z);
		if (cz.specialization)
		{
			z.id = execution.workgroup_size.id_z;
			z.constant_id = get_decoration(execution.workgroup_size.id_z, DecorationSpecId);
		}
	}

	return execution.workgroup_size.constant;
}